

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

void CopyConstantRaw(InstructionVMEvalContext *ctx,char *dst,uint dstSize,VmConstant *src,
                    uint storeSize)

{
  bool bVar1;
  uint uVar2;
  StackFrame **ppSVar3;
  uint local_58;
  uint local_54;
  uint index;
  uint offset;
  VariableData *variable;
  unsigned_long_long pointer;
  float tmp_2;
  short tmp_1;
  char tmp;
  StackFrame *frame;
  VmConstant *pVStack_28;
  uint storeSize_local;
  VmConstant *src_local;
  char *pcStack_18;
  uint dstSize_local;
  char *dst_local;
  InstructionVMEvalContext *ctx_local;
  
  frame._4_4_ = storeSize;
  pVStack_28 = src;
  src_local._4_4_ = dstSize;
  pcStack_18 = dst;
  dst_local = (char *)ctx;
  ppSVar3 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  _tmp_2 = *ppSVar3;
  if (src_local._4_4_ < frame._4_4_) {
    __assert_fail("dstSize >= storeSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x15c,
                  "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                 );
  }
  bVar1 = VmType::operator==(&(pVStack_28->super_VmValue).type,&VmType::Int);
  if (bVar1) {
    if (frame._4_4_ == 1) {
      pointer._7_1_ = (undefined1)pVStack_28->iValue;
      memcpy(pcStack_18,(void *)((long)&pointer + 7),1);
    }
    else if (frame._4_4_ == 2) {
      pointer._4_2_ = (undefined2)pVStack_28->iValue;
      memcpy(pcStack_18,(void *)((long)&pointer + 4),2);
    }
    else {
      if (frame._4_4_ != 4) {
        __assert_fail("!\"invalid store size\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                      ,0x170,
                      "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                     );
      }
      memcpy(pcStack_18,&pVStack_28->iValue,4);
    }
  }
  else {
    bVar1 = VmType::operator==(&(pVStack_28->super_VmValue).type,&VmType::Double);
    if (bVar1) {
      if (frame._4_4_ == 4) {
        pointer._0_4_ = (float)pVStack_28->dValue;
        memcpy(pcStack_18,&pointer,4);
      }
      else {
        if (frame._4_4_ != 8) {
          __assert_fail("!\"invalid store size\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x180,
                        "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                       );
        }
        memcpy(pcStack_18,&pVStack_28->dValue,8);
      }
    }
    else {
      bVar1 = VmType::operator==(&(pVStack_28->super_VmValue).type,&VmType::Long);
      if (bVar1) {
        if ((pVStack_28->super_VmValue).type.size != 8) {
          __assert_fail("src->type.size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x185,
                        "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                       );
        }
        memcpy(pcStack_18,&pVStack_28->lValue,(ulong)(pVStack_28->super_VmValue).type.size);
      }
      else if ((pVStack_28->super_VmValue).type.type == VM_TYPE_POINTER) {
        if ((pVStack_28->super_VmValue).type.size != 8) {
          __assert_fail("src->type.size == sizeof(void*)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x18b,
                        "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                       );
        }
        variable = (VariableData *)0x0;
        _index = pVStack_28->container;
        if (_index == (VariableData *)0x0) {
          variable = (VariableData *)(long)pVStack_28->iValue;
        }
        else {
          if (_index->importModule != (ModuleData *)0x0) {
            anon_unknown.dwarf_1b3692::Report
                      ((InstructionVMEvalContext *)dst_local,
                       "ERROR: can\'t access imported variable");
            return;
          }
          local_54 = GetAllocaAddress((InstructionVMEvalContext *)dst_local,_index);
          if (local_54 == 0) {
            bVar1 = IsGlobalScope(_index->scope);
            if (bVar1) {
              variable = (VariableData *)(ulong)(pVStack_28->iValue + _index->offset);
              if ((VariableData *)((ulong)variable & 0xffff) != variable) {
                __assert_fail("(pointer & memoryOffsetMask) == pointer",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                              ,0x1a0,
                              "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                             );
              }
              uVar2 = GetStorageIndex((InstructionVMEvalContext *)dst_local,
                                      (Storage *)(*(long *)(dst_local + 0x18) + 0x1d0));
              variable = (VariableData *)((ulong)(uVar2 << 0x10) | (ulong)variable);
            }
            else {
              variable = (VariableData *)(ulong)(pVStack_28->iValue + _index->offset);
              if ((VariableData *)((ulong)variable & 0xffff) != variable) {
                __assert_fail("(pointer & memoryOffsetMask) == pointer",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                              ,0x1a6,
                              "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                             );
              }
              uVar2 = GetStorageIndex((InstructionVMEvalContext *)dst_local,&_tmp_2->stack);
              variable = (VariableData *)((ulong)(uVar2 << 0x10) | (ulong)variable);
            }
          }
          else {
            variable = (VariableData *)(ulong)(pVStack_28->iValue + local_54);
            if ((VariableData *)((ulong)variable & 0xffff) != variable) {
              __assert_fail("(pointer & memoryOffsetMask) == pointer",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                            ,0x19a,
                            "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                           );
            }
            uVar2 = GetStorageIndex((InstructionVMEvalContext *)dst_local,&_tmp_2->allocas);
            variable = (VariableData *)((ulong)(uVar2 << 0x10) | (ulong)variable);
          }
        }
        memcpy(pcStack_18,&variable,(ulong)(pVStack_28->super_VmValue).type.size);
      }
      else if (pVStack_28->sValue == (char *)0x0) {
        if (pVStack_28->fValue == (VmFunction *)0x0) {
          __assert_fail("!\"unknown constant type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x1bf,
                        "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                       );
        }
        if ((pVStack_28->super_VmValue).type.size != 4) {
          __assert_fail("src->type.size == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x1b7,
                        "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                       );
        }
        local_58 = ExpressionContext::GetFunctionIndex
                             (*(ExpressionContext **)dst_local,pVStack_28->fValue->function);
        memcpy(pcStack_18,&local_58,(ulong)(pVStack_28->super_VmValue).type.size);
      }
      else {
        memcpy(pcStack_18,pVStack_28->sValue,(ulong)(pVStack_28->super_VmValue).type.size);
      }
    }
  }
  return;
}

Assistant:

void CopyConstantRaw(InstructionVMEvalContext &ctx, char *dst, unsigned dstSize, VmConstant *src, unsigned storeSize)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	(void)dstSize;
	assert(dstSize >= storeSize);

	if(src->type == VmType::Int)
	{
		if(storeSize == 1)
		{
			char tmp = (char)src->iValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 2)
		{
			short tmp = (short)src->iValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 4)
		{
			memcpy(dst, &src->iValue, storeSize);
		}
		else
		{
			assert(!"invalid store size");
		}
	}
	else if(src->type == VmType::Double)
	{
		if(storeSize == 4)
		{
			float tmp = (float)src->dValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 8)
		{
			memcpy(dst, &src->dValue, storeSize);
		}
		else
		{
			assert(!"invalid store size");
		}
	}
	else if(src->type == VmType::Long)
	{
		assert(src->type.size == 8);

		memcpy(dst, &src->lValue, src->type.size);
	}
	else if(src->type.type == VM_TYPE_POINTER)
	{
		assert(src->type.size == sizeof(void*));

		unsigned long long pointer = 0;

		if(VariableData *variable = src->container)
		{
			if(variable->importModule)
			{
				Report(ctx, "ERROR: can't access imported variable");
				return;
			}

			if(unsigned offset = GetAllocaAddress(ctx, variable))
			{
				pointer = src->iValue + offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &frame->allocas) << memoryStorageBits;
			}
			else if(IsGlobalScope(variable->scope))
			{
				pointer = src->iValue + variable->offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &ctx.globalFrame->stack) << memoryStorageBits;
			}
			else
			{
				pointer = src->iValue + variable->offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &frame->stack) << memoryStorageBits;
			}
		}
		else
		{
			pointer = src->iValue;
		}

		memcpy(dst, &pointer, src->type.size);
	}
	else if(src->sValue)
	{
		memcpy(dst, src->sValue, src->type.size);
	}
	else if(src->fValue)
	{
		assert(src->type.size == 4);

		unsigned index = ctx.ctx.GetFunctionIndex(src->fValue->function);

		memcpy(dst, &index, src->type.size);
	}
	else
	{
		assert(!"unknown constant type");
	}
}